

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_identify(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  undefined8 uVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  long *plVar11;
  CProficiencies *pCVar12;
  ulong uVar13;
  uint uVar14;
  char buf [4608];
  
  pcVar10 = buf;
  bVar4 = is_npc(ch);
  bVar5 = true;
  if (!bVar4) {
    if (ch->pcdata == (PC_DATA *)0x0) {
      pCVar12 = &prof_none;
    }
    else {
      pCVar12 = &ch->pcdata->profs;
    }
    iVar6 = CProficiencies::GetProf(pCVar12,"forgotten lore");
    if (-1 < iVar6) {
      send_to_char("Your knowledge of forgotten lore grants you additional insight.\n\r",ch);
      if (ch->pcdata == (PC_DATA *)0x0) {
        pCVar12 = &prof_none;
      }
      else {
        pCVar12 = &ch->pcdata->profs;
      }
      CProficiencies::CheckImprove(pCVar12,"forgotten lore",100);
      bVar5 = false;
    }
  }
  uVar1 = *(undefined8 *)((long)vo + 0x80);
  pcVar7 = item_name_lookup((int)*(short *)((long)vo + 0x98));
  pcVar8 = extra_bit_name((long *)((long)vo + 0xa0));
  sprintf(buf,"Object \'%s\' is type %s, extra flags %s.\n\r",uVar1,pcVar7,pcVar8);
  sVar9 = strlen(buf);
  builtin_strncpy(buf + sVar9,"It appears to be made of ",0x1a);
  strcat(buf,*(char **)((long)vo + 0x110));
  sVar9 = strlen(buf);
  builtin_strncpy(buf + sVar9,".\n\r",4);
  send_to_char(buf,ch);
  switch(*(short *)((long)vo + 0x98)) {
  case 3:
  case 4:
    sprintf(buf,"It is enchanted with %d charges of level %d",(ulong)*(uint *)((long)vo + 0x124),
            (ulong)*(uint *)((long)vo + 0x11c));
    send_to_char(buf,ch);
    pcVar10 = ".\n\r";
    if ((799 < (ulong)*(uint *)((long)vo + 0x128)) ||
       (bVar5 = str_cmp(skill_table[*(uint *)((long)vo + 0x128)].name,"reserved"), !bVar5)) break;
    send_to_char(" \'",ch);
    iVar6 = *(int *)((long)vo + 0x128);
    goto LAB_003084d1;
  case 5:
    send_to_char("It appears to be a",ch);
    if ((ulong)*(uint *)((long)vo + 0x11c) < 10) {
      pcVar7 = &DAT_003e0924 + *(int *)(&DAT_003e0924 + (ulong)*(uint *)((long)vo + 0x11c) * 4);
    }
    else {
      pcVar7 = " weapon of unknown species.\n\r";
    }
    send_to_char(pcVar7,ch);
    uVar3 = (long)((*(int *)((long)vo + 0x124) + 1) * *(int *)((long)vo + 0x120)) / 2;
    uVar13 = uVar3 & 0xffffffff;
    if (bVar5) {
      iVar6 = number_range(-5,3);
      uVar13 = (ulong)(uint)((int)uVar3 + iVar6);
      pcVar7 = "The average damage is probably around %d.\n\r";
    }
    else {
      pcVar7 = "Damage averages %d.\n\r";
    }
    sprintf(buf,pcVar7,uVar13);
    break;
  case 6:
  case 7:
  case 8:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    goto switchD_003082a7_caseD_6;
  case 9:
    sprintf(buf,"Armor class averages %d.\n\r",
            (long)(*(int *)((long)vo + 0x120) + *(int *)((long)vo + 0x11c) +
                   *(int *)((long)vo + 0x124) + *(int *)((long)vo + 0x128)) / 4 & 0xffffffff);
    pcVar10 = buf;
    if (bVar5) goto switchD_003082a7_caseD_6;
    break;
  case 0xf:
    pcVar10 = "can";
    uVar14 = *(uint *)((long)vo + 0x11c);
    if (bVar5) {
      pcVar10 = "might be able to";
      iVar6 = number_range((int)uVar14 / -2,(int)uVar14 / 2);
      uVar14 = uVar14 + iVar6;
    }
    sprintf(buf,"It %s contain about %d objects.\n\r",pcVar10,(ulong)uVar14);
    pcVar10 = buf;
    break;
  default:
    if (*(short *)((long)vo + 0x98) != 0x1a) goto switchD_003082a7_caseD_6;
  case 2:
  case 10:
    sprintf(buf,"It is enchanted with level %d spells of:",(ulong)*(uint *)((long)vo + 0x11c));
    send_to_char(buf,ch);
    if (((ulong)*(uint *)((long)vo + 0x120) < 800) &&
       (bVar5 = str_cmp(skill_table[*(uint *)((long)vo + 0x120)].name,"reserved"), bVar5)) {
      send_to_char(" \'",ch);
      send_to_char(skill_table[*(int *)((long)vo + 0x120)].name,ch);
      send_to_char("\'",ch);
    }
    if (((ulong)*(uint *)((long)vo + 0x124) < 800) &&
       (bVar5 = str_cmp(skill_table[*(uint *)((long)vo + 0x124)].name,"reserved"), bVar5)) {
      send_to_char(" \'",ch);
      send_to_char(skill_table[*(int *)((long)vo + 0x124)].name,ch);
      send_to_char("\'",ch);
    }
    if (((ulong)*(uint *)((long)vo + 0x128) < 800) &&
       (bVar5 = str_cmp(skill_table[*(uint *)((long)vo + 0x128)].name,"reserved"), bVar5)) {
      send_to_char(" \'",ch);
      send_to_char(skill_table[*(int *)((long)vo + 0x128)].name,ch);
      send_to_char("\'",ch);
    }
    pcVar10 = ".\n\r";
    if (((ulong)*(uint *)((long)vo + 300) < 800) &&
       (bVar5 = str_cmp(skill_table[*(uint *)((long)vo + 300)].name,"reserved"), bVar5)) {
      send_to_char(" \'",ch);
      iVar6 = *(int *)((long)vo + 300);
LAB_003084d1:
      send_to_char(skill_table[iVar6].name,ch);
      send_to_char("\'",ch);
      pcVar10 = ".\n\r";
    }
  }
  send_to_char(pcVar10,ch);
switchD_003082a7_caseD_6:
  plVar11 = (long *)((long)vo + 0x38);
  while (lVar2 = *plVar11, lVar2 != 0) {
    pcVar10 = affect_loc_name((int)*(short *)(lVar2 + 2));
    sprintf(buf,"Affects %s by %d.\n\r",pcVar10,(ulong)(uint)(int)*(short *)(lVar2 + 4));
    send_to_char(buf,ch);
    plVar11 = (long *)(lVar2 + 8);
  }
  return;
}

Assistant:

void spell_identify(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *obj = (OBJ_DATA *)vo;
	char buf[MAX_STRING_LENGTH];
	OBJ_APPLY_DATA *app;
	int lorebonus = 0;

	if (!is_npc(ch) && (lorebonus = ch->Profs()->GetProf("forgotten lore") > -1))
	{
		send_to_char("Your knowledge of forgotten lore grants you additional insight.\n\r", ch);
		ch->Profs()->CheckImprove("forgotten lore", 100);
	}

	lorebonus = std::max(lorebonus, 0);

	sprintf(buf, "Object '%s' is type %s, extra flags %s.\n\r",
		obj->name,
		item_name_lookup(obj->item_type),
		extra_bit_name(obj->extra_flags));
	strcat(buf, "It appears to be made of ");
	strcat(buf, obj->material);
	strcat(buf, ".\n\r");
	send_to_char(buf, ch);

	switch (obj->item_type)
	{
		case ITEM_SCROLL:
		case ITEM_POTION:
		case ITEM_PILL:
			sprintf(buf, "It is enchanted with level %d spells of:", obj->value[0]);
			send_to_char(buf, ch);

			if (obj->value[1] >= 0 && obj->value[1] < MAX_SKILL && str_cmp(skill_table[obj->value[1]].name, "reserved"))
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[1]].name, ch);
				send_to_char("'", ch);
			}

			if (obj->value[2] >= 0 && obj->value[2] < MAX_SKILL && str_cmp(skill_table[obj->value[2]].name, "reserved"))
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[2]].name, ch);
				send_to_char("'", ch);
			}

			if (obj->value[3] >= 0 && obj->value[3] < MAX_SKILL && str_cmp(skill_table[obj->value[3]].name, "reserved"))
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[3]].name, ch);
				send_to_char("'", ch);
			}

			if (obj->value[4] >= 0 && obj->value[4] < MAX_SKILL && str_cmp(skill_table[obj->value[4]].name, "reserved"))
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[4]].name, ch);
				send_to_char("'", ch);
			}

			send_to_char(".\n\r", ch);
			break;
		case ITEM_WAND:
		case ITEM_STAFF:
			sprintf(buf, "It is enchanted with %d charges of level %d", obj->value[2], obj->value[0]);
			send_to_char(buf, ch);

			if (obj->value[3] >= 0 && obj->value[3] < MAX_SKILL && str_cmp(skill_table[obj->value[3]].name, "reserved"))
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[3]].name, ch);
				send_to_char("'", ch);
			}

			send_to_char(".\n\r", ch);
			break;
		case ITEM_CONTAINER:
			sprintf(buf, "It %s contain about %d objects.\n\r",
				lorebonus ? "can" : "might be able to",
				lorebonus ? obj->value[0] : obj->value[0] + number_range(obj->value[0] * -1 / 2, obj->value[0] * 1 / 2));
			send_to_char(buf, ch);

			break;
		case ITEM_WEAPON:
			send_to_char("It appears to be a", ch);

			switch (obj->value[0])
			{
				case WEAPON_EXOTIC:
					send_to_char("n exotic.\n\r", ch);
					break;
				case WEAPON_SWORD:
					send_to_char(" sword.\n\r", ch);
					break;
				case WEAPON_DAGGER:
					send_to_char(" dagger.\n\r", ch);
					break;
				case WEAPON_SPEAR:
					send_to_char(" spear/staff.\n\r", ch);
					break;
				case WEAPON_MACE:
					send_to_char(" mace/club.\n\r", ch);
					break;
				case WEAPON_AXE:
					send_to_char("n axe.\n\r", ch);
					break;
				case WEAPON_FLAIL:
					send_to_char(" flail.\n\r", ch);
					break;
				case WEAPON_WHIP:
					send_to_char(" whip.\n\r", ch);
					break;
				case WEAPON_POLEARM:
					send_to_char(" polearm.\n\r", ch);
					break;
				case WEAPON_STAFF:
					send_to_char(" staff.\n\r", ch);
					break;
				default:
					send_to_char(" weapon of unknown species.\n\r", ch);
					break;
			}

			if (lorebonus)
				sprintf(buf, "Damage averages %d.\n\r", (1 + obj->value[2]) * obj->value[1] / 2);
			else
				sprintf(buf, "The average damage is probably around %d.\n\r", ((1 + obj->value[2]) * obj->value[1] / 2) + number_range(-5, 3));

			send_to_char(buf, ch);
			break;
		case ITEM_ARMOR:
			sprintf(buf, "Armor class averages %d.\n\r", (obj->value[0] + obj->value[1] + obj->value[2] + obj->value[3]) / 4);

			if (lorebonus)
				send_to_char(buf, ch);

			break;
	}

	for (app = obj->apply; app; app = app->next)
	{
		sprintf(buf, "Affects %s by %d.\n\r", affect_loc_name(app->location), app->modifier);
		send_to_char(buf, ch);
	}
}